

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuncCastEmulation.cpp
# Opt level: O1

Expression * wasm::toABI(Expression *value,Module *module)

{
  ulong uVar1;
  Expression *item;
  Unary *this;
  Block *this_00;
  Builder local_38;
  Builder builder;
  
  uVar1 = (value->type).id;
  local_38.wasm = module;
  if (6 < uVar1) {
    __assert_fail("isBasic() && \"Basic type expected\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-type.h"
                  ,0xc6,"BasicType wasm::Type::getBasic() const");
  }
  this_00 = (Block *)value;
  switch(uVar1 & 0xffffffff) {
  case 0:
    item = LiteralUtils::makeZero((Type)0x3,module);
    this_00 = Builder::makeBlock(&local_38,value);
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&(this_00->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,item);
    Block::finalize(this_00);
    break;
  case 2:
    this_00 = (Block *)MixedArena::allocSpace(&module->allocator,0x20,8);
    (this_00->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id = UnaryId;
    (this_00->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = 0;
    *(undefined4 *)&(this_00->name).super_IString.str._M_len = 0x17;
    goto LAB_006f9019;
  case 4:
    this = (Unary *)MixedArena::allocSpace(&module->allocator,0x20,8);
    (this->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id = UnaryId;
    (this->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id = 0;
    this->op = ReinterpretFloat32;
    this->value = value;
    Unary::finalize(this);
    this_00 = (Block *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x20,8);
    (this_00->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id = UnaryId;
    (this_00->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = 0;
    *(undefined4 *)&(this_00->name).super_IString.str._M_len = 0x17;
    (this_00->name).super_IString.str._M_str = (char *)this;
    Unary::finalize((Unary *)this_00);
    break;
  case 5:
    this_00 = (Block *)MixedArena::allocSpace(&module->allocator,0x20,8);
    (this_00->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id = UnaryId;
    (this_00->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = 0;
    *(undefined4 *)&(this_00->name).super_IString.str._M_len = 0x22;
LAB_006f9019:
    (this_00->name).super_IString.str._M_str = (char *)value;
    Unary::finalize((Unary *)this_00);
    break;
  case 6:
    handle_unreachable("v128 not implemented yet",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/FuncCastEmulation.cpp"
                       ,0x3f);
  }
  return (Expression *)this_00;
}

Assistant:

static Expression* toABI(Expression* value, Module* module) {
  Builder builder(*module);
  switch (value->type.getBasic()) {
    case Type::i32: {
      value = builder.makeUnary(ExtendUInt32, value);
      break;
    }
    case Type::i64: {
      // already good
      break;
    }
    case Type::f32: {
      value = builder.makeUnary(ExtendUInt32,
                                builder.makeUnary(ReinterpretFloat32, value));
      break;
    }
    case Type::f64: {
      value = builder.makeUnary(ReinterpretFloat64, value);
      break;
    }
    case Type::v128: {
      WASM_UNREACHABLE("v128 not implemented yet");
    }
    case Type::none: {
      // the value is none, but we need a value here
      value =
        builder.makeSequence(value, LiteralUtils::makeZero(Type::i64, *module));
      break;
    }
    case Type::unreachable: {
      // can leave it, the call isn't taken anyhow
      break;
    }
  }
  return value;
}